

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Task.cpp
# Opt level: O2

bool __thiscall TaskSpec::has_lock(TaskSpec *this,DatabaseLock *oth)

{
  __index_type _Var1;
  bool bVar2;
  anon_class_8_1_8991fb9c local_10;
  
  _Var1 = (oth->super__Variant_base<DatasetLock,_IteratorLock>).
          super__Move_assign_alias<DatasetLock,_IteratorLock>.
          super__Copy_assign_alias<DatasetLock,_IteratorLock>.
          super__Move_ctor_alias<DatasetLock,_IteratorLock>.
          super__Copy_ctor_alias<DatasetLock,_IteratorLock>.
          super__Variant_storage_alias<DatasetLock,_IteratorLock>._M_index;
  local_10.this = (Database *)this;
  if (_Var1 == 0xff) {
    std::__throw_bad_variant_access("std::visit: variant is valueless");
    _Var1 = (oth->super__Variant_base<DatasetLock,_IteratorLock>).
            super__Move_assign_alias<DatasetLock,_IteratorLock>.
            super__Copy_assign_alias<DatasetLock,_IteratorLock>.
            super__Move_ctor_alias<DatasetLock,_IteratorLock>.
            super__Copy_ctor_alias<DatasetLock,_IteratorLock>.
            super__Variant_storage_alias<DatasetLock,_IteratorLock>._M_index;
  }
  bVar2 = (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__deduce_visit_result<bool>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/Task.cpp:46:23)_&&,_const_std::variant<DatasetLock,_IteratorLock>_&>
            ::_S_vtable._M_arr[(char)_Var1]._M_data)(&local_10,oth);
  return bVar2;
}

Assistant:

bool TaskSpec::has_lock(const DatabaseLock &oth) const {
    return std::visit([this](const auto &l) { return has_typed_lock(l); }, oth);
}